

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 456.test.cpp
# Opt level: O3

void verifyChunkLNU1(Type<1,_456> *chunk)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_1_456_hpp:57:42),_const_std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>_&>
  _Var1;
  int iVar2;
  variant_alternative_t<0UL,_variant<PolynomialMultiplicity,_TabulatedMultiplicity>_> *pvVar3;
  long lVar4;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_1_456_hpp:74:46),_const_std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>_&>
  _Var5;
  Multiplicity *__variants;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_e0;
  double local_98;
  undefined1 local_90 [8];
  undefined8 local_88;
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd3;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "456 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName,(SourceLineInfo *)local_90,capturedExpression,ContinueOnFailure);
  local_88._0_2_ = 0x101;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 0x1c8;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = 0x1c8;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd4;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "456 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_00,(SourceLineInfo *)local_90,capturedExpression_00,
             ContinueOnFailure);
  local_88._0_2_ = 0x101;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 0x1c8;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = 0x1c8;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd5;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_01,(SourceLineInfo *)local_90,capturedExpression_01,
             ContinueOnFailure);
  iVar2 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).ZA_;
  local_88._1_1_ = iVar2 == 0x1684b;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 0x1684b;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd6;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_02,(SourceLineInfo *)local_90,capturedExpression_02,
             ContinueOnFailure);
  iVar2 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).ZA_;
  local_88._1_1_ = iVar2 == 0x1684b;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 0x1684b;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd7;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x30;
  capturedExpression_03.m_start = "233.0248, WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_03,(SourceLineInfo *)local_90,capturedExpression_03,
             ContinueOnFailure);
  local_98 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).atomicWeightRatio_);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd8;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x22;
  capturedExpression_04.m_start = "233.0248, WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_04,(SourceLineInfo *)local_90,capturedExpression_04,
             ContinueOnFailure);
  local_98 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).atomicWeightRatio_);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xd9;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "1 == chunk.LNU()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_05,(SourceLineInfo *)local_90,capturedExpression_05,
             ContinueOnFailure);
  __variants = &chunk->data_;
  _Var1 = std::
          visit<njoy::ENDFtk::section::Type<1,456>::LNU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>const&>
                    (&local_52,__variants);
  local_88._1_1_ = _Var1 == 1;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 1;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = _Var1;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xda;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1b;
  capturedExpression_06.m_start = "1 == chunk.representation()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_06,(SourceLineInfo *)local_90,capturedExpression_06,
             ContinueOnFailure);
  _Var1 = std::
          visit<njoy::ENDFtk::section::Type<1,456>::LNU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>const&>
                    (&local_51,__variants);
  local_88._1_1_ = _Var1 == 1;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 1;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = _Var1;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  pvVar3 = std::
           get<0ul,njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>
                     (__variants);
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xde;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x10;
  capturedExpression_07.m_start = "1 == nubar.LNU()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_07,(SourceLineInfo *)local_90,capturedExpression_07,
             ContinueOnFailure);
  local_88._0_2_ = 0x101;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 1;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xdf;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1b;
  capturedExpression_08.m_start = "1 == nubar.representation()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_08,(SourceLineInfo *)local_90,capturedExpression_08,
             ContinueOnFailure);
  local_88._0_2_ = 0x101;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 1;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe1;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x10;
  capturedExpression_09.m_start = "2 == nubar.NCO()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_09,(SourceLineInfo *)local_90,capturedExpression_09,
             ContinueOnFailure);
  iVar2 = (int)((ulong)((long)(pvVar3->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pvVar3->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_88._1_1_ = iVar2 == 2;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 2;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe2;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1f;
  capturedExpression_10.m_start = "2 == nubar.numberCoefficients()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_10,(SourceLineInfo *)local_90,capturedExpression_10,
             ContinueOnFailure);
  iVar2 = (int)((ulong)((long)(pvVar3->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pvVar3->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_88._1_1_ = iVar2 == 2;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db318;
  local_88._4_4_ = 2;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  local_78[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe3;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x15;
  capturedExpression_11.m_start = "2 == nubar.C().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_11,(SourceLineInfo *)local_90,capturedExpression_11,
             ContinueOnFailure);
  lVar4 = (long)(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_78[0]._8_8_ = lVar4 >> 3;
  local_88._1_1_ = lVar4 == 0x10;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db398;
  local_88._4_4_ = 2;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe4;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x20;
  capturedExpression_12.m_start = "2 == nubar.coefficients().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_12,(SourceLineInfo *)local_90,capturedExpression_12,
             ContinueOnFailure);
  lVar4 = (long)(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_78[0]._8_8_ = lVar4 >> 3;
  local_88._1_1_ = lVar4 == 0x10;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db398;
  local_88._4_4_ = 2;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe5;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x21;
  capturedExpression_13.m_start = "2.4367, WithinRel( nubar.C()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_13,(SourceLineInfo *)local_90,capturedExpression_13,
             ContinueOnFailure);
  local_98 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             *(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe6;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x1f;
  capturedExpression_14.m_start = "5e-2, WithinRel( nubar.C()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_14,(SourceLineInfo *)local_90,capturedExpression_14,
             ContinueOnFailure);
  local_98 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             (pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe7;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x2c;
  capturedExpression_15.m_start = "2.4367, WithinRel( nubar.coefficients()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_15,(SourceLineInfo *)local_90,capturedExpression_15,
             ContinueOnFailure);
  local_98 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             *(pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xe8;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x2a;
  capturedExpression_16.m_start = "5e-2, WithinRel( nubar.coefficients()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_16,(SourceLineInfo *)local_90,capturedExpression_16,
             ContinueOnFailure);
  local_98 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_90,
             (pvVar3->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_90,&local_98);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db358;
  local_40 = &local_98;
  local_38 = (WithinRelMatcher *)local_90;
  Catch::AssertionHandler::handleExpr(&local_e0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_90 = (undefined1  [8])0x19c484;
  local_88 = (pointer)0xea;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0xf;
  capturedExpression_17.m_start = "3 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e0,macroName_17,(SourceLineInfo *)local_90,capturedExpression_17,
             ContinueOnFailure);
  _Var5 = std::
          visit<njoy::ENDFtk::section::Type<1,456>::NC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>const&>
                    ((anon_class_1_0_00000001 *)&local_50,__variants);
  local_78[0]._8_8_ = _Var5 + 1;
  local_88._1_1_ = local_78[0]._8_8_ == 3;
  local_88._0_1_ = true;
  local_90 = (undefined1  [8])&PTR_streamReconstructedExpression_001db3d8;
  local_88._4_4_ = 3;
  local_80 = "==";
  local_78[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_e0,(ITransientExpression *)local_90);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_90);
  Catch::AssertionHandler::complete(&local_e0);
  if (local_e0.m_completed == false) {
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunkLNU1( const section::Type< 1, 456 >& chunk ) {

  CHECK( 456 == chunk.MT() );
  CHECK( 456 == chunk.sectionNumber() );
  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0248, WithinRel( chunk.atomicWeightRatio() ) );
  CHECK_THAT( 233.0248, WithinRel( chunk.AWR() ) );
  CHECK( 1 == chunk.LNU() );
  CHECK( 1 == chunk.representation() );

  const auto& nubar = std::get< PolynomialMultiplicity >( chunk.nubar() );

  CHECK( 1 == nubar.LNU() );
  CHECK( 1 == nubar.representation() );

  CHECK( 2 == nubar.NCO() );
  CHECK( 2 == nubar.numberCoefficients() );
  CHECK( 2 == nubar.C().size() );
  CHECK( 2 == nubar.coefficients().size() );
  CHECK_THAT( 2.4367, WithinRel( nubar.C()[0] ) );
  CHECK_THAT( 5e-2, WithinRel( nubar.C()[1] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.coefficients()[0] ) );
  CHECK_THAT( 5e-2, WithinRel( nubar.coefficients()[1] ) );

  CHECK( 3 == chunk.NC() );
}